

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

void chunk_undo(spng_ctx *ctx)

{
  spng_unknown_chunk *psVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  psVar1 = ctx->chunk_list;
  uVar4 = ctx->n_chunks - 1;
  (*(ctx->alloc).free_fn)(psVar1[uVar4].data);
  uVar2 = psVar1[uVar4].length;
  uVar3 = ctx->chunk_cache_usage;
  if (uVar2 <= uVar3 && (uVar2 != 0 && ctx != (spng_ctx *)0x0)) {
    ctx->chunk_cache_usage = uVar3 - uVar2;
    uVar3 = uVar3 - uVar2;
  }
  if (0x1f < uVar3) {
    ctx->chunk_cache_usage = uVar3 - 0x20;
  }
  psVar1[uVar4].data = (void *)0x0;
  ctx->n_chunks = ctx->n_chunks - 1;
  return;
}

Assistant:

static void chunk_undo(spng_ctx *ctx)
{
    struct spng_unknown_chunk *chunk = &ctx->chunk_list[ctx->n_chunks - 1];

    spng__free(ctx, chunk->data);

    decrease_cache_usage(ctx, chunk->length);
    decrease_cache_usage(ctx, sizeof(struct spng_unknown_chunk));

    chunk->data = NULL;

    ctx->n_chunks--;
}